

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flicker_remover_cpu.cxx
# Opt level: O1

void __thiscall FlickerRemoverCPU::clear(FlickerRemoverCPU *this)

{
  uint uVar1;
  uint uVar2;
  BooleanArray2D **ppBVar3;
  uint uVar4;
  BooleanArray2D *pBVar5;
  
  uVar1 = (this->corresponding_frames_similarity_levels).count_of_elements;
  pBVar5 = (BooleanArray2D *)0x0;
  if (uVar1 != 0) {
    ppBVar3 = (this->corresponding_frames_similarity_levels).data;
    uVar2 = (this->corresponding_frames_similarity_levels).first_element_index;
    pBVar5 = ppBVar3[uVar2];
    ppBVar3[uVar2] = (BooleanArray2D *)0x0;
    uVar4 = uVar2 + 1;
    if (uVar2 == (this->corresponding_frames_similarity_levels).count_of_slots - 1) {
      uVar4 = 0;
    }
    (this->corresponding_frames_similarity_levels).first_element_index = uVar4;
    (this->corresponding_frames_similarity_levels).count_of_elements = uVar1 - 1;
  }
  while (pBVar5 != (BooleanArray2D *)0x0) {
    BooleanArray2D::~BooleanArray2D(pBVar5);
    operator_delete(pBVar5,0x10);
    uVar1 = (this->corresponding_frames_similarity_levels).count_of_elements;
    if (uVar1 == 0) {
      pBVar5 = (BooleanArray2D *)0x0;
    }
    else {
      ppBVar3 = (this->corresponding_frames_similarity_levels).data;
      uVar2 = (this->corresponding_frames_similarity_levels).first_element_index;
      pBVar5 = ppBVar3[uVar2];
      ppBVar3[uVar2] = (BooleanArray2D *)0x0;
      uVar4 = uVar2 + 1;
      if (uVar2 == (this->corresponding_frames_similarity_levels).count_of_slots - 1) {
        uVar4 = 0;
      }
      (this->corresponding_frames_similarity_levels).first_element_index = uVar4;
      (this->corresponding_frames_similarity_levels).count_of_elements = uVar1 - 1;
    }
  }
  uVar1 = (this->adjacent_frames_similarity_levels).count_of_elements;
  pBVar5 = (BooleanArray2D *)0x0;
  if (uVar1 != 0) {
    ppBVar3 = (this->adjacent_frames_similarity_levels).data;
    uVar2 = (this->adjacent_frames_similarity_levels).first_element_index;
    pBVar5 = ppBVar3[uVar2];
    ppBVar3[uVar2] = (BooleanArray2D *)0x0;
    uVar4 = uVar2 + 1;
    if (uVar2 == (this->adjacent_frames_similarity_levels).count_of_slots - 1) {
      uVar4 = 0;
    }
    (this->adjacent_frames_similarity_levels).first_element_index = uVar4;
    (this->adjacent_frames_similarity_levels).count_of_elements = uVar1 - 1;
  }
  while (pBVar5 != (BooleanArray2D *)0x0) {
    BooleanArray2D::~BooleanArray2D(pBVar5);
    operator_delete(pBVar5,0x10);
    uVar1 = (this->adjacent_frames_similarity_levels).count_of_elements;
    if (uVar1 == 0) {
      pBVar5 = (BooleanArray2D *)0x0;
    }
    else {
      ppBVar3 = (this->adjacent_frames_similarity_levels).data;
      uVar2 = (this->adjacent_frames_similarity_levels).first_element_index;
      pBVar5 = ppBVar3[uVar2];
      ppBVar3[uVar2] = (BooleanArray2D *)0x0;
      uVar4 = uVar2 + 1;
      if (uVar2 == (this->adjacent_frames_similarity_levels).count_of_slots - 1) {
        uVar4 = 0;
      }
      (this->adjacent_frames_similarity_levels).first_element_index = uVar4;
      (this->adjacent_frames_similarity_levels).count_of_elements = uVar1 - 1;
    }
  }
  return;
}

Assistant:

void FlickerRemoverCPU::clear()
{
    auto to_delete_1 = corresponding_frames_similarity_levels.pop();
    while(to_delete_1 != nullptr) {
        delete to_delete_1;
        to_delete_1 = corresponding_frames_similarity_levels.pop();
    }
    auto to_delete_2 = adjacent_frames_similarity_levels.pop();
    while(to_delete_2 != nullptr) {
        delete to_delete_2;
        to_delete_2 = adjacent_frames_similarity_levels.pop();
    }
}